

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec * cram_beta_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  khint32_t kVar1;
  uint local_4c;
  int local_48;
  khint_t k;
  int i;
  int len;
  int max_val;
  int min_val;
  cram_codec *c;
  int version_local;
  void *dat_local;
  cram_external_type option_local;
  cram_stats *st_local;
  
  k = 0;
  st_local = (cram_stats *)malloc(0x240);
  if (st_local == (cram_stats *)0x0) {
    st_local = (cram_stats *)0x0;
  }
  else {
    st_local->freqs[0] = 6;
    *(code **)(st_local->freqs + 4) = cram_beta_encode_free;
    if (option == E_INT) {
      *(code **)(st_local->freqs + 8) = cram_beta_encode_int;
    }
    else {
      *(code **)(st_local->freqs + 8) = cram_beta_encode_char;
    }
    *(code **)(st_local->freqs + 10) = cram_beta_encode_store;
    if (dat == (void *)0x0) {
      len = 0x7fffffff;
      i = -0x80000000;
      for (local_48 = 0; local_48 < 0x400; local_48 = local_48 + 1) {
        if (st->freqs[local_48] != 0) {
          if (local_48 < len) {
            len = local_48;
          }
          i = local_48;
        }
      }
      if (st->h != (kh_m_i2i_t *)0x0) {
        for (local_4c = 0; local_4c != st->h->n_buckets; local_4c = local_4c + 1) {
          if ((st->h->flags[local_4c >> 4] >> (sbyte)((local_4c & 0xf) << 1) & 3) == 0) {
            kVar1 = st->h->keys[local_4c];
            if ((int)kVar1 < len) {
              len = kVar1;
            }
            if (i < (int)kVar1) {
              i = kVar1;
            }
          }
        }
      }
    }
    else {
      len = *dat;
      i = *(int *)((long)dat + 4);
    }
    if (i < len) {
      __assert_fail("max_val >= min_val",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                    ,0x2a7,
                    "cram_codec *cram_beta_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                   );
    }
    st_local->freqs[0xc] = -len;
    for (i = i - len; i != 0; i = i >> 1) {
      k = k + 1;
    }
    st_local->freqs[0xd] = k;
  }
  return (cram_codec *)st_local;
}

Assistant:

cram_codec *cram_beta_encode_init(cram_stats *st,
				  enum cram_external_type option,
				  void *dat,
				  int version) {
    cram_codec *c;
    int min_val, max_val, len = 0;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec  = E_BETA;
    c->free   = cram_beta_encode_free;
    if (option == E_INT)
	c->encode = cram_beta_encode_int;
    else
	c->encode = cram_beta_encode_char;
    c->store  = cram_beta_encode_store;

    if (dat) {
	min_val = ((int *)dat)[0];
	max_val = ((int *)dat)[1];
    } else {
	min_val = INT_MAX;
	max_val = INT_MIN;
	int i;
	for (i = 0; i < MAX_STAT_VAL; i++) {
	    if (!st->freqs[i])
		continue;
	    if (min_val > i)
		min_val = i;
	    max_val = i;
	}
	if (st->h) {
	    khint_t k;

	    for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
		if (!kh_exist(st->h, k))
		    continue;
	    
		i = kh_key(st->h, k);
		if (min_val > i)
		    min_val = i;
		if (max_val < i)
		    max_val = i;
	    }
	}
    }

    assert(max_val >= min_val);
    c->e_beta.offset = -min_val;
    max_val -= min_val;
    while (max_val) {
	len++;
	max_val >>= 1;
    }
    c->e_beta.nbits = len;

    return c;
}